

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O0

JL_STATUS UnmarshalBinary(JlDataObject *Object,void *DataSizeField,size_t DataSizeFieldSize,
                         JlMarshallElement *Description,_Bool IgnoreExistingValuesInStruct,
                         void *Output,size_t *pErrorAtPos)

{
  size_t sVar1;
  long *local_68;
  size_t local_60;
  size_t dataSize;
  uint8_t *data;
  void **BufferPtr;
  char *stringPtr;
  void *pvStack_38;
  JL_STATUS jlStatus;
  void *Output_local;
  JlMarshallElement *pJStack_28;
  _Bool IgnoreExistingValuesInStruct_local;
  JlMarshallElement *Description_local;
  size_t DataSizeFieldSize_local;
  void *DataSizeField_local;
  JlDataObject *Object_local;
  
  BufferPtr = (void **)0x0;
  local_68 = (long *)Output;
  if (Description->FieldSize != 0) {
    local_68 = (long *)0x0;
  }
  data = (uint8_t *)local_68;
  pvStack_38 = Output;
  Output_local._7_1_ = IgnoreExistingValuesInStruct;
  pJStack_28 = Description;
  Description_local = (JlMarshallElement *)DataSizeFieldSize;
  DataSizeFieldSize_local = (size_t)DataSizeField;
  DataSizeField_local = Object;
  if (((!IgnoreExistingValuesInStruct) && (Description->FieldSize == 0)) && (*local_68 != 0)) {
    WjTestLib_Free((void *)*local_68);
    data[0] = '\0';
    data[1] = '\0';
    data[2] = '\0';
    data[3] = '\0';
    data[4] = '\0';
    data[5] = '\0';
    data[6] = '\0';
    data[7] = '\0';
  }
  stringPtr._4_4_ = JlGetObjectString((JlDataObject *)DataSizeField_local,(char **)&BufferPtr);
  if (stringPtr._4_4_ == JL_STATUS_SUCCESS) {
    dataSize = 0;
    local_60 = 0;
    if (BufferPtr == (void **)0x0) {
      if (pJStack_28->FieldSize == 0) {
        data[0] = '\0';
        data[1] = '\0';
        data[2] = '\0';
        data[3] = '\0';
        data[4] = '\0';
        data[5] = '\0';
        data[6] = '\0';
        data[7] = '\0';
        stringPtr._4_4_ =
             JlMemoryWriteCountValue((void *)DataSizeFieldSize_local,(size_t)Description_local,0);
      }
      else {
        stringPtr._4_4_ = JL_STATUS_INVALID_DATA;
      }
    }
    else {
      stringPtr._4_4_ = JlBase64Decode((char *)BufferPtr,(void **)&dataSize,&local_60);
      if (stringPtr._4_4_ == JL_STATUS_SUCCESS) {
        if (pJStack_28->FieldSize == 0) {
          *(size_t *)data = dataSize;
          stringPtr._4_4_ =
               JlMemoryWriteCountValue
                         ((void *)DataSizeFieldSize_local,(size_t)Description_local,local_60);
          if (stringPtr._4_4_ != JL_STATUS_SUCCESS) {
            data[0] = '\0';
            data[1] = '\0';
            data[2] = '\0';
            data[3] = '\0';
            data[4] = '\0';
            data[5] = '\0';
            data[6] = '\0';
            data[7] = '\0';
            WjTestLib_Free((void *)dataSize);
            dataSize = 0;
          }
        }
        else {
          if (local_60 == pJStack_28->FieldSize) {
            memcpy(pvStack_38,(void *)dataSize,local_60);
          }
          else {
            stringPtr._4_4_ = JL_STATUS_INVALID_DATA;
          }
          WjTestLib_Free((void *)dataSize);
          dataSize = 0;
        }
      }
    }
  }
  if ((stringPtr._4_4_ != JL_STATUS_SUCCESS) && (pErrorAtPos != (size_t *)0x0)) {
    sVar1 = JlGetObjectTag((JlDataObject *)DataSizeField_local);
    *pErrorAtPos = sVar1;
  }
  return stringPtr._4_4_;
}

Assistant:

static
JL_STATUS
    UnmarshalBinary
    (
        JlDataObject const*         Object,
        void*                       DataSizeField,
        size_t                      DataSizeFieldSize,
        JlMarshallElement const*    Description,
        bool                        IgnoreExistingValuesInStruct,
        void*                       Output,
        size_t*                     pErrorAtPos
    )
{
    JL_STATUS jlStatus;
    char const* stringPtr = NULL;
    void** BufferPtr = 0==Description->FieldSize ? (void**)Output : NULL;    // Only when its an allocated buffer

    if( !IgnoreExistingValuesInStruct && 0==Description->FieldSize && NULL != *BufferPtr )
    {
        // Free the existing buffer here. Note this requires that the buffer had been allocated by this library
        // on a previous unmarshall, and was not pointing to a static string or junk memory.
        JlFree( *BufferPtr );
        *BufferPtr = NULL;
    }

    jlStatus = JlGetObjectString( Object, &stringPtr );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        // Convert base64 to binary
        uint8_t* data = NULL;
        size_t dataSize = 0;

        if( NULL != stringPtr )
        {
            jlStatus = JlBase64Decode( stringPtr, (void**)&data, &dataSize );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                if( 0 == Description->FieldSize )
                {
                    // Set the pointer in struct to the allocated buffer
                    *BufferPtr = data;

                    // Set the size
                    jlStatus = JlMemoryWriteCountValue( DataSizeField, DataSizeFieldSize, dataSize );
                    if( JL_STATUS_SUCCESS == jlStatus )
                    {
                        // Success
                    }
                    else
                    {
                        // deallocate
                        *BufferPtr = NULL;
                        JlFree( data );
                        data = NULL;
                    }
                }
                else
                {
                    // Fixed sized buffer in struct.
                    if( dataSize == Description->FieldSize )
                    {
                        // Copy in data
                        memcpy( Output, data, dataSize );
                    }
                    else
                    {
                        // Base64 decoded to a different size from the fixed size buffer. This is invalid as
                        // there is no size field used.
                        jlStatus = JL_STATUS_INVALID_DATA;
                    }

                    JlFree( data );
                    data = NULL;
                }
            }
        }
        else
        {
            // Null string.
            if( 0 == Description->FieldSize )
            {
                *BufferPtr = NULL;
                jlStatus = JlMemoryWriteCountValue( DataSizeField, DataSizeFieldSize, 0 );
            }
            else
            {
                // Invalid for a fixed size field
                jlStatus = JL_STATUS_INVALID_DATA;
            }
        }
    }

    if( JL_STATUS_SUCCESS != jlStatus )
    {
        if( NULL != pErrorAtPos )
        {
            *pErrorAtPos = JlGetObjectTag( Object );
        }
    }

    return jlStatus;
}